

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<unsigned_char,long_long>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_02;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_03;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_04;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_05;
  longlong u2;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  uchar t;
  longlong u;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffdf8
  ;
  undefined5 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe05;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe06;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe07;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffe08
  ;
  undefined6 in_stack_fffffffffffffe10;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffe18
  ;
  uchar local_19;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_b;
  byte local_a;
  uchar local_9;
  longlong local_8;
  
  local_8 = 0;
  local_9 = 0;
  local_a = 0;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (longlong *)in_stack_fffffffffffffdf8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_18,&local_8);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int);
  local_a = (local_a ^ 0xff) & 1;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (uchar *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (longlong *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int);
  local_b.m_int = local_19;
  SafeInt::operator_cast_to_long_long
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator*(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs.m_int._5_1_ = in_stack_fffffffffffffe05;
  rhs.m_int._0_5_ = in_stack_fffffffffffffe00;
  rhs.m_int._6_1_ = in_stack_fffffffffffffe06.m_int;
  rhs.m_int._7_1_ = in_stack_fffffffffffffe07.m_int;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,rhs);
  local_8 = 1;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_00.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_00.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_00.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_00);
  local_8 = 1;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator/(in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  i.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  i.m_int._0_6_ = in_stack_fffffffffffffe10;
  i.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,i);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator+(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_01.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_01.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_01.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_01);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  local_8 = 0;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator-(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  rhs_02.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_02.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_02.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_02);
  local_8 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             in_stack_fffffffffffffe18);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator<<('\0',in_stack_fffffffffffffdf8);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  bits.m_int._5_1_ = in_stack_fffffffffffffe05;
  bits.m_int._0_5_ = in_stack_fffffffffffffe00;
  bits.m_int._6_1_ = in_stack_fffffffffffffe06.m_int;
  bits.m_int._7_1_ = in_stack_fffffffffffffe07.m_int;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,bits);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             in_stack_fffffffffffffe18);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator>>('\0',in_stack_fffffffffffffdf8);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  bits_00.m_int._5_1_ = in_stack_fffffffffffffe05;
  bits_00.m_int._0_5_ = in_stack_fffffffffffffe00;
  bits_00.m_int._6_1_ = in_stack_fffffffffffffe06.m_int;
  bits_00.m_int._7_1_ = in_stack_fffffffffffffe07.m_int;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,bits_00);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator&(in_stack_fffffffffffffe07.m_int,in_stack_fffffffffffffe08);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_fffffffffffffe07.m_int,
                                CONCAT16(in_stack_fffffffffffffe06.m_int,
                                         CONCAT15(in_stack_fffffffffffffe05,
                                                  in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_03.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_03.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_03.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_03);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator|(in_stack_fffffffffffffe07.m_int,in_stack_fffffffffffffe08);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_fffffffffffffe07.m_int,
                                CONCAT16(in_stack_fffffffffffffe06.m_int,
                                         CONCAT15(in_stack_fffffffffffffe05,
                                                  in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_04.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_04.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_04.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_04);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator^(in_stack_fffffffffffffe07.m_int,in_stack_fffffffffffffe08);
  local_9 = SafeInt::operator_cast_to_unsigned_char
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_fffffffffffffe07.m_int,
                                CONCAT16(in_stack_fffffffffffffe06.m_int,
                                         CONCAT15(in_stack_fffffffffffffe05,
                                                  in_stack_fffffffffffffe00))));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_05.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_05.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_05.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_05);
  local_a = operator<(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator<(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8.m_int);
  local_a = operator<(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  local_a = operator<(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator<=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator<=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8.m_int);
  local_a = operator<=(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  local_a = operator<=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator>(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator>(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8.m_int);
  local_a = operator>(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  local_a = operator>(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator>=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator>=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8.m_int);
  local_a = operator>=(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  local_a = operator>=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator==(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  lhs.m_int = local_b.m_int;
  local_a = operator==(local_b,in_stack_fffffffffffffdf8.m_int);
  local_a = operator==(in_stack_fffffffffffffdf8.m_int,lhs);
  operator==(lhs,local_18);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}